

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O3

uint32_t InstructionSet::x86::
         address<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (Instruction<false> *instruction,DataPointer pointer,Context *context)

{
  uint uVar1;
  uint32_t uVar2;
  ushort local_4 [2];
  
  uVar1 = 0;
  switch(pointer.source_) {
  case C0:
    return (uint32_t)(context->registers).ax_.full;
  case C1:
    return (uint32_t)(context->registers).cx_.full;
  case C2:
    return (uint32_t)(context->registers).dx_.full;
  case C3:
    return (uint32_t)(context->registers).bx_.full;
  case AH:
    return (uint32_t)(context->registers).sp_;
  case C5:
    return (uint32_t)(context->registers).bp_;
  case C6:
    return (uint32_t)(context->registers).si_;
  case BH:
    return (uint32_t)(context->registers).di_;
  case DirectAddress:
    local_4[0] = 0;
    local_4[1] = *(undefined2 *)
                  ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2))
    ;
    uVar1 = (uint)*(ushort *)((long)local_4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    break;
  case IndirectNoBase:
    uVar2 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,pointer,context);
    return uVar2;
  case Indirect:
    uVar2 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,pointer,context);
    return uVar2;
  }
  return uVar1;
}

Assistant:

uint32_t address(
	InstructionT &instruction,
	DataPointer pointer,
	ContextT &context
) {
	// TODO: at least on the 8086 this isn't how register 'addresses' are resolved; instead whatever was the last computed address
	// remains in the address register and is returned. Find out what other x86s do and make a decision.
	switch(pointer.source()) {
		default:						return 0;
		case Source::eAX:				return *register_<IntT, access, Source::eAX>(context);
		case Source::eCX:				return *register_<IntT, access, Source::eCX>(context);
		case Source::eDX:				return *register_<IntT, access, Source::eDX>(context);
		case Source::eBX:				return *register_<IntT, access, Source::eBX>(context);
		case Source::eSPorAH:			return *register_<IntT, access, Source::eSPorAH>(context);
		case Source::eBPorCH:			return *register_<IntT, access, Source::eBPorCH>(context);
		case Source::eSIorDH:			return *register_<IntT, access, Source::eSIorDH>(context);
		case Source::eDIorBH:			return *register_<IntT, access, Source::eDIorBH>(context);
		case Source::Indirect:			return address<Source::Indirect, IntT, access>(instruction, pointer, context);
		case Source::IndirectNoBase:	return address<Source::IndirectNoBase, IntT, access>(instruction, pointer, context);
		case Source::DirectAddress:		return address<Source::DirectAddress, IntT, access>(instruction, pointer, context);
	}
}